

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall
t_lua_generator::generate_deserialize_set_element
          (t_lua_generator *this,ostream *out,t_set *tset,string *prefix)

{
  t_type *type;
  ostream *poVar1;
  string elem;
  t_field felem;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  t_field local_e0;
  
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"_elem","");
  t_generator::tmp(&local_160,(t_generator *)this,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  type = tset->elem_type_;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  t_field::t_field(&local_e0,type,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
  generate_deserialize_field(this,out,&local_e0,true,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"[",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] = ",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_160._M_dataplus._M_p,local_160._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_field::~t_field(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_set_element(ostream& out, t_set* tset, string prefix) {
  // A set is represented by a table indexed by the value
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  generate_deserialize_field(out, &felem, true);

  indent(out) << prefix << "[" << elem << "] = " << elem << endl;
}